

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
CDT::predict(vector<double,_std::allocator<double>_> *__return_storage_ptr__,CDT *this,
            Matrix<double> *input_matrix)

{
  uint row;
  double local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (row = 0; row < (input_matrix->m_shape).n_row; row = row + 1) {
    Matrix<double>::get((vector<double,_std::allocator<double>_> *)&local_48,input_matrix,row);
    local_50 = feed_forward(this,(vector<double,_std::allocator<double>_> *)&local_48);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_50);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> CDT::predict(const Matrix_d& input_matrix) const{
    std::vector<double> results;
    for(unsigned i=0;i<input_matrix.shape().n_row;++i)
        results.push_back(predict(input_matrix.get(i)));
    return results;
}